

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

boolean clear_stale_map(char oclass,uint material)

{
  level *plVar1;
  boolean bVar2;
  uint uVar3;
  long lVar4;
  monst *pmVar5;
  obj *poVar6;
  ulong uVar7;
  obj *poVar8;
  long lVar9;
  
  lVar4 = 1;
  bVar2 = '\0';
  do {
    lVar9 = 0;
    do {
      plVar1 = level;
      uVar7 = (ulong)material;
      uVar3 = *(uint *)(level->locations[lVar4] + lVar9) >> 0xb & 0x3ff;
      if (uVar3 != 0) {
        if (oclass == '\x14') {
          if (level->objects[lVar4][lVar9] == (obj *)0x0) {
            pmVar5 = level->monsters[lVar4][lVar9];
            if (pmVar5 == (monst *)0x0) {
              pmVar5 = (monst *)0x0;
            }
            else if ((pmVar5->field_0x61 & 2) != 0) {
              pmVar5 = (monst *)0x0;
            }
            if ((pmVar5 == (monst *)0x0) || (pmVar5->minvent == (obj *)0x0)) goto LAB_00160229;
          }
        }
        else if ((material == 0) ||
                ((*(ushort *)&objects[(ulong)uVar3 - 1].field_0x11 >> 4 & 0x1f) != material)) {
          if ((oclass != '\0') && (objects[(ulong)uVar3 - 1].oc_class == oclass)) {
            for (poVar8 = level->objects[lVar4][lVar9]; poVar8 != (obj *)0x0;
                poVar8 = (poVar8->v).v_nexthere) {
              poVar6 = o_in(poVar8,oclass);
              if (poVar6 != (obj *)0x0) goto LAB_0016023d;
            }
            pmVar5 = plVar1->monsters[lVar4][lVar9];
            if (pmVar5 == (monst *)0x0) {
              pmVar5 = (monst *)0x0;
            }
            else if ((pmVar5->field_0x61 & 2) != 0) {
              pmVar5 = (monst *)0x0;
            }
            if (pmVar5 == (monst *)0x0) goto LAB_00160229;
            poVar8 = (obj *)&pmVar5->minvent;
            do {
              poVar8 = poVar8->nobj;
              if (poVar8 == (obj *)0x0) goto LAB_00160229;
              poVar6 = o_in(poVar8,oclass);
            } while (poVar6 == (obj *)0x0);
          }
        }
        else {
          for (poVar8 = level->objects[lVar4][lVar9]; poVar8 != (obj *)0x0;
              poVar8 = (poVar8->v).v_nexthere) {
            poVar6 = o_material(poVar8,(uint)uVar7);
            if (poVar6 != (obj *)0x0) goto LAB_0016023d;
          }
          pmVar5 = plVar1->monsters[lVar4][lVar9];
          if (pmVar5 == (monst *)0x0) {
            pmVar5 = (monst *)0x0;
          }
          else if ((pmVar5->field_0x61 & 2) != 0) {
            pmVar5 = (monst *)0x0;
          }
          if (pmVar5 == (monst *)0x0) {
LAB_00160229:
            unmap_object((int)lVar4,(int)lVar9);
            bVar2 = '\x01';
          }
          else {
            poVar8 = (obj *)&pmVar5->minvent;
            do {
              poVar8 = poVar8->nobj;
              if (poVar8 == (obj *)0x0) goto LAB_00160229;
              poVar6 = o_material(poVar8,(uint)uVar7);
            } while (poVar6 == (obj *)0x0);
          }
        }
      }
LAB_0016023d:
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x15);
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x50) {
      return bVar2;
    }
  } while( true );
}

Assistant:

static boolean clear_stale_map(char oclass, unsigned material)
{
	int zx, zy;
	boolean change_made = FALSE;

	for (zx = 1; zx < COLNO; zx++)
	    for (zy = 0; zy < ROWNO; zy++)
		if (check_map_spot(zx, zy, oclass,material)) {
		    unmap_object(zx, zy);
		    change_made = TRUE;
		}

	return change_made;
}